

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O2

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool polish)

{
  shared_ptr<soplex::Tolerances> *psVar1;
  char cVar2;
  undefined8 uVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  ulong uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  double local_3e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_358;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_318;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_158;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  cpp_dec_float<50U,_int,_void> local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  
  maxabs.m_backend.fpclass = cpp_dec_float_finite;
  maxabs.m_backend.prec_elem = 10;
  maxabs.m_backend.data._M_elems[0] = 0;
  maxabs.m_backend.data._M_elems[1] = 0;
  maxabs.m_backend.data._M_elems[2] = 0;
  maxabs.m_backend.data._M_elems[3] = 0;
  maxabs.m_backend.data._M_elems[4] = 0;
  maxabs.m_backend.data._M_elems[5] = 0;
  maxabs.m_backend.data._M_elems._24_5_ = 0;
  maxabs.m_backend.data._M_elems[7]._1_3_ = 0;
  maxabs.m_backend.data._M_elems._32_5_ = 0;
  maxabs.m_backend.data._M_elems[9]._1_3_ = 0;
  maxabs.m_backend.exp = 0;
  maxabs.m_backend.neg = false;
  local_4d8.m_backend.fpclass = cpp_dec_float_finite;
  local_4d8.m_backend.prec_elem = 10;
  local_4d8.m_backend.data._M_elems[0] = 0;
  local_4d8.m_backend.data._M_elems[1] = 0;
  local_4d8.m_backend.data._M_elems[2] = 0;
  local_4d8.m_backend.data._M_elems[3] = 0;
  local_4d8.m_backend.data._M_elems[4] = 0;
  local_4d8.m_backend.data._M_elems[5] = 0;
  local_4d8.m_backend.data._M_elems._24_5_ = 0;
  local_4d8.m_backend.data._M_elems[7]._1_3_ = 0;
  local_4d8.m_backend.data._M_elems._32_5_ = 0;
  local_4d8.m_backend.data._M_elems[9]._1_3_ = 0;
  local_4d8.m_backend.exp = 0;
  local_4d8.m_backend.neg = false;
  sel.m_backend.fpclass = cpp_dec_float_finite;
  sel.m_backend.prec_elem = 10;
  sel.m_backend.data._M_elems[0] = 0;
  sel.m_backend.data._M_elems[1] = 0;
  sel.m_backend.data._M_elems[2] = 0;
  sel.m_backend.data._M_elems[3] = 0;
  sel.m_backend.data._M_elems[4] = 0;
  sel.m_backend.data._M_elems[5] = 0;
  sel.m_backend.data._M_elems._24_5_ = 0;
  sel.m_backend.data._M_elems[7]._1_3_ = 0;
  sel.m_backend.data._M_elems._32_5_ = 0;
  sel.m_backend.data._M_elems[9]._1_3_ = 0;
  sel.m_backend.exp = 0;
  sel.m_backend.neg = false;
  psVar1 = &(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._tolerances;
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&lowstab,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar11 = -(ulong)(*(double *)(lowstab.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&delta_shift.m_backend,
             (double)(~uVar11 & (ulong)(*(double *)(lowstab.m_backend.data._M_elems._0_8_ + 0x40) *
                                       1e-05) | uVar11 & 0x3ee4f8b588e368f1),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lowstab.m_backend.data._M_elems + 2));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar6) + 0x6b4);
  std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&result_2,
             &psVar1->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
  uVar11 = -(ulong)(*(double *)(result_2.m_backend.data._M_elems._0_8_ + 0x40) == 1.0);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&lowstab.m_backend,
             (double)(~uVar11 & (ulong)(*(double *)(result_2.m_backend.data._M_elems._0_8_ + 0x40) *
                                       1e-10) | uVar11 & 0x3ddb7cdfd9d7bdbb),(type *)0x0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(result_2.m_backend.data._M_elems + 2));
  resetTols(this);
  uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
  result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
  result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
  result_2.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
  result_2.m_backend.data._M_elems._16_8_ =
       *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
  uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
  result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
  result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
  result_2.m_backend.exp = (this->epsilon).m_backend.exp;
  result_2.m_backend.neg = (this->epsilon).m_backend.neg;
  result_2.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
  result_2.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
  tVar4 = boost::multiprecision::operator>(val,&result_2);
  if (tVar4) {
    iVar6 = 0;
    do {
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_4d8.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_4d8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_4d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_4d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_4d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_4d8.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_4d8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_4d8.m_backend.exp = (val->m_backend).exp;
      local_4d8.m_backend.neg = (val->m_backend).neg;
      local_4d8.m_backend.fpclass = (val->m_backend).fpclass;
      local_4d8.m_backend.prec_elem = (val->m_backend).prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&maxabs,0.0);
      uVar7 = maxDelta(this,&local_4d8,&maxabs);
      bVar5 = boost::multiprecision::operator==(&local_4d8,val);
      if (bVar5) {
        return -1;
      }
      if (uVar7 == 0xffffffff) {
        return -1;
      }
      local_118.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_118.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_118.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_118.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_118.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_118.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_118.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_118.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_118.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_118.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_118.m_backend.exp = maxabs.m_backend.exp;
      local_118.m_backend.neg = maxabs.m_backend.neg;
      local_118.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_118.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar5 = maxShortLeave(this,&sel,uVar7,&local_118);
      if (!bVar5) {
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        bestDelta.m_backend.fpclass = cpp_dec_float_finite;
        bestDelta.m_backend.prec_elem = 10;
        bestDelta.m_backend.data._M_elems[0] = 0;
        bestDelta.m_backend.data._M_elems[1] = 0;
        bestDelta.m_backend.data._M_elems[2] = 0;
        bestDelta.m_backend.data._M_elems[3] = 0;
        bestDelta.m_backend.data._M_elems[4] = 0;
        bestDelta.m_backend.data._M_elems[5] = 0;
        bestDelta.m_backend.data._M_elems._24_5_ = 0;
        bestDelta.m_backend.data._M_elems[7]._1_3_ = 0;
        bestDelta.m_backend.data._M_elems._32_5_ = 0;
        bestDelta.m_backend._37_8_ = 0;
        local_3e0 = 100.0;
        local_158.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
        local_158.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
        local_158.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
        local_158.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
        local_158.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
        local_158.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
        local_158.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
        local_158.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
        local_158.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
        local_158.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
        local_158.m_backend.exp = maxabs.m_backend.exp;
        local_158.m_backend.neg = maxabs.m_backend.neg;
        local_158.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_158.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_d8,this,&local_158);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&result.m_backend,&local_d8,&local_3e0);
        result_2.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_2.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_2.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_2.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_2.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        result_2.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        result_2.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_2.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_2.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_2.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_2.m_backend.exp = result.m_backend.exp;
        result_2.m_backend.neg = result.m_backend.neg;
        result_2.m_backend.fpclass = result.m_backend.fpclass;
        result_2.m_backend.prec_elem = result.m_backend.prec_elem;
        if (cVar2 == '\0') {
          local_1d8.m_backend.data._M_elems[9]._1_3_ = local_4d8.m_backend.data._M_elems[9]._1_3_;
          local_1d8.m_backend.data._M_elems._32_5_ = local_4d8.m_backend.data._M_elems._32_5_;
          local_1d8.m_backend.data._M_elems[7]._1_3_ = local_4d8.m_backend.data._M_elems[7]._1_3_;
          local_1d8.m_backend.data._M_elems._24_5_ = local_4d8.m_backend.data._M_elems._24_5_;
          local_1d8.m_backend.data._M_elems[4] = local_4d8.m_backend.data._M_elems[4];
          local_1d8.m_backend.data._M_elems[5] = local_4d8.m_backend.data._M_elems[5];
          local_1d8.m_backend.data._M_elems[0] = local_4d8.m_backend.data._M_elems[0];
          local_1d8.m_backend.data._M_elems[1] = local_4d8.m_backend.data._M_elems[1];
          local_1d8.m_backend.data._M_elems[2] = local_4d8.m_backend.data._M_elems[2];
          local_1d8.m_backend.data._M_elems[3] = local_4d8.m_backend.data._M_elems[3];
          local_1d8.m_backend.exp = local_4d8.m_backend.exp;
          local_1d8.m_backend.neg = local_4d8.m_backend.neg;
          local_1d8.m_backend.fpclass = local_4d8.m_backend.fpclass;
          local_1d8.m_backend.prec_elem = local_4d8.m_backend.prec_elem;
          pnVar9 = &result_2;
          pnVar10 = &local_1d8;
        }
        else {
          local_198.m_backend.data._M_elems[9]._1_3_ = local_4d8.m_backend.data._M_elems[9]._1_3_;
          local_198.m_backend.data._M_elems._32_5_ = local_4d8.m_backend.data._M_elems._32_5_;
          local_198.m_backend.data._M_elems[7]._1_3_ = local_4d8.m_backend.data._M_elems[7]._1_3_;
          local_198.m_backend.data._M_elems._24_5_ = local_4d8.m_backend.data._M_elems._24_5_;
          local_198.m_backend.data._M_elems[4] = local_4d8.m_backend.data._M_elems[4];
          local_198.m_backend.data._M_elems[5] = local_4d8.m_backend.data._M_elems[5];
          local_198.m_backend.data._M_elems[0] = local_4d8.m_backend.data._M_elems[0];
          local_198.m_backend.data._M_elems[1] = local_4d8.m_backend.data._M_elems[1];
          local_198.m_backend.data._M_elems[2] = local_4d8.m_backend.data._M_elems[2];
          local_198.m_backend.data._M_elems[3] = local_4d8.m_backend.data._M_elems[3];
          local_198.m_backend.exp = local_4d8.m_backend.exp;
          local_198.m_backend.neg = local_4d8.m_backend.neg;
          local_198.m_backend.fpclass = local_4d8.m_backend.fpclass;
          local_198.m_backend.prec_elem = local_4d8.m_backend.prec_elem;
          pnVar9 = &lowstab;
          pnVar10 = &local_198;
        }
        uVar7 = maxSelect(this,&sel,pnVar9,&bestDelta,pnVar10);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        local_d8.data._M_elems[0] = 2;
        local_d8.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&result.m_backend,&delta_shift.m_backend,(longlong *)&local_d8);
        tVar4 = boost::multiprecision::operator<
                          (&bestDelta,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        iVar6 = (iVar6 - (uint)tVar4) + 2;
      }
      uVar11 = (ulong)uVar7;
      local_218.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_218.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_218.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_218.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_218.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_218.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_218.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_218.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_218.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_218.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_218.m_backend.exp = maxabs.m_backend.exp;
      local_218.m_backend.neg = maxabs.m_backend.neg;
      local_218.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_218.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar5 = maxReLeave(this,&sel,uVar7,&local_218,polish);
    } while ((bVar5) && (relax(this), iVar6 < 2));
  }
  else {
    uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
    result_2.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
    result_2.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    result_2.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
    result_2.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
    result_2.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
    uVar3 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
    result_2.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
    result_2.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    result_2.m_backend.exp = (this->epsilon).m_backend.exp;
    result_2.m_backend.neg = (this->epsilon).m_backend.neg;
    result_2.m_backend.fpclass = (this->epsilon).m_backend.fpclass;
    result_2.m_backend.prec_elem = (this->epsilon).m_backend.prec_elem;
    if (result_2.m_backend.fpclass != cpp_dec_float_finite ||
        result_2.m_backend.data._M_elems[0] != 0) {
      result_2.m_backend.neg = (bool)(result_2.m_backend.neg ^ 1);
    }
    tVar4 = boost::multiprecision::operator<(val,&result_2);
    if (!tVar4) {
      return -1;
    }
    iVar6 = 0;
    do {
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_4d8.m_backend.data._M_elems._32_5_ = SUB85(uVar3,0);
      local_4d8.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_4d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_4d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_4d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4)
      ;
      uVar3 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_4d8.m_backend.data._M_elems._24_5_ = SUB85(uVar3,0);
      local_4d8.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_4d8.m_backend.exp = (val->m_backend).exp;
      local_4d8.m_backend.neg = (val->m_backend).neg;
      local_4d8.m_backend.fpclass = (val->m_backend).fpclass;
      local_4d8.m_backend.prec_elem = (val->m_backend).prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxabs.m_backend,0)
      ;
      uVar7 = minDelta(this,&local_4d8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&maxabs.m_backend);
      bVar5 = boost::multiprecision::operator==(&local_4d8,val);
      if (bVar5) {
        return -1;
      }
      if (uVar7 == 0xffffffff) {
        return -1;
      }
      local_258.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_258.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_258.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_258.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_258.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_258.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_258.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_258.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_258.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_258.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_258.m_backend.exp = maxabs.m_backend.exp;
      local_258.m_backend.neg = maxabs.m_backend.neg;
      local_258.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_258.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar5 = minShortLeave(this,&sel,uVar7,&local_258);
      if (!bVar5) {
        result_2.m_backend.fpclass = cpp_dec_float_finite;
        result_2.m_backend.prec_elem = 10;
        result_2.m_backend.data._M_elems[0] = 0;
        result_2.m_backend.data._M_elems[1] = 0;
        result_2.m_backend.data._M_elems[2] = 0;
        result_2.m_backend.data._M_elems[3] = 0;
        result_2.m_backend.data._M_elems[4] = 0;
        result_2.m_backend.data._M_elems[5] = 0;
        result_2.m_backend.data._M_elems._24_5_ = 0;
        result_2.m_backend.data._M_elems[7]._1_3_ = 0;
        result_2.m_backend.data._M_elems._32_5_ = 0;
        result_2.m_backend.data._M_elems[9]._1_3_ = 0;
        result_2.m_backend.exp = 0;
        result_2.m_backend.neg = false;
        bestDelta.m_backend.fpclass = cpp_dec_float_finite;
        bestDelta.m_backend.prec_elem = 10;
        bestDelta.m_backend.data._M_elems[0] = 0;
        bestDelta.m_backend.data._M_elems[1] = 0;
        bestDelta.m_backend.data._M_elems[2] = 0;
        bestDelta.m_backend.data._M_elems[3] = 0;
        bestDelta.m_backend.data._M_elems[4] = 0;
        bestDelta.m_backend.data._M_elems[5] = 0;
        bestDelta.m_backend.data._M_elems._24_5_ = 0;
        bestDelta.m_backend.data._M_elems[7]._1_3_ = 0;
        bestDelta.m_backend.data._M_elems._32_5_ = 0;
        bestDelta.m_backend._37_8_ = 0;
        local_3e0 = 100.0;
        local_298.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
        local_298.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
        local_298.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
        local_298.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
        local_298.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
        local_298.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
        local_298.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
        local_298.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
        local_298.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
        local_298.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
        local_298.m_backend.exp = maxabs.m_backend.exp;
        local_298.m_backend.neg = maxabs.m_backend.neg;
        local_298.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_298.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        minStability((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_d8,this,&local_298);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
                  (&result.m_backend,&local_d8,&local_3e0);
        result_2.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_2.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_2.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_2.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_2.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        result_2.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        result_2.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_2.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_2.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_2.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_2.m_backend.exp = result.m_backend.exp;
        result_2.m_backend.neg = result.m_backend.neg;
        result_2.m_backend.fpclass = result.m_backend.fpclass;
        result_2.m_backend.prec_elem = result.m_backend.prec_elem;
        if (cVar2 == '\0') {
          local_318.m_backend.data._M_elems[9]._1_3_ = local_4d8.m_backend.data._M_elems[9]._1_3_;
          local_318.m_backend.data._M_elems._32_5_ = local_4d8.m_backend.data._M_elems._32_5_;
          local_318.m_backend.data._M_elems[7]._1_3_ = local_4d8.m_backend.data._M_elems[7]._1_3_;
          local_318.m_backend.data._M_elems._24_5_ = local_4d8.m_backend.data._M_elems._24_5_;
          local_318.m_backend.data._M_elems[4] = local_4d8.m_backend.data._M_elems[4];
          local_318.m_backend.data._M_elems[5] = local_4d8.m_backend.data._M_elems[5];
          local_318.m_backend.data._M_elems[0] = local_4d8.m_backend.data._M_elems[0];
          local_318.m_backend.data._M_elems[1] = local_4d8.m_backend.data._M_elems[1];
          local_318.m_backend.data._M_elems[2] = local_4d8.m_backend.data._M_elems[2];
          local_318.m_backend.data._M_elems[3] = local_4d8.m_backend.data._M_elems[3];
          local_318.m_backend.exp = local_4d8.m_backend.exp;
          local_318.m_backend.neg = local_4d8.m_backend.neg;
          local_318.m_backend.fpclass = local_4d8.m_backend.fpclass;
          local_318.m_backend.prec_elem = local_4d8.m_backend.prec_elem;
          pnVar9 = &result_2;
          pnVar10 = &local_318;
        }
        else {
          local_2d8.m_backend.data._M_elems[9]._1_3_ = local_4d8.m_backend.data._M_elems[9]._1_3_;
          local_2d8.m_backend.data._M_elems._32_5_ = local_4d8.m_backend.data._M_elems._32_5_;
          local_2d8.m_backend.data._M_elems[7]._1_3_ = local_4d8.m_backend.data._M_elems[7]._1_3_;
          local_2d8.m_backend.data._M_elems._24_5_ = local_4d8.m_backend.data._M_elems._24_5_;
          local_2d8.m_backend.data._M_elems[4] = local_4d8.m_backend.data._M_elems[4];
          local_2d8.m_backend.data._M_elems[5] = local_4d8.m_backend.data._M_elems[5];
          local_2d8.m_backend.data._M_elems[0] = local_4d8.m_backend.data._M_elems[0];
          local_2d8.m_backend.data._M_elems[1] = local_4d8.m_backend.data._M_elems[1];
          local_2d8.m_backend.data._M_elems[2] = local_4d8.m_backend.data._M_elems[2];
          local_2d8.m_backend.data._M_elems[3] = local_4d8.m_backend.data._M_elems[3];
          local_2d8.m_backend.exp = local_4d8.m_backend.exp;
          local_2d8.m_backend.neg = local_4d8.m_backend.neg;
          local_2d8.m_backend.fpclass = local_4d8.m_backend.fpclass;
          local_2d8.m_backend.prec_elem = local_4d8.m_backend.prec_elem;
          pnVar9 = &lowstab;
          pnVar10 = &local_2d8;
        }
        uVar7 = minSelect(this,&sel,pnVar9,&bestDelta,pnVar10);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        local_d8.data._M_elems[0] = 2;
        local_d8.data._M_elems[1] = 0;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
                  (&result.m_backend,&delta_shift.m_backend,(longlong *)&local_d8);
        tVar4 = boost::multiprecision::operator<
                          (&bestDelta,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result.m_backend);
        iVar6 = (iVar6 - (uint)tVar4) + 2;
      }
      uVar11 = (ulong)uVar7;
      local_358.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_358.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_358.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_358.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_358.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_358.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_358.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_358.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_358.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_358.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_358.m_backend.exp = maxabs.m_backend.exp;
      local_358.m_backend.neg = maxabs.m_backend.neg;
      local_358.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_358.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar5 = minReLeave(this,&sel,uVar7,&local_358,polish);
    } while ((bVar5) && (relax(this), iVar6 < 2));
  }
  iVar6 = (int)uVar11;
  if (polish && -1 < iVar6) {
    this_00 = (this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver;
    result_2.m_backend.data._M_elems._0_8_ =
         (this_00->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).theBaseId.data[uVar11].super_DataKey;
    iVar8 = result_2.m_backend.data._M_elems[0];
    if (this_00->polishObj == POLISH_FRACTIONALITY) {
      if ((this_00->integerVariables).thesize ==
          (this_00->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        if ((0 < iVar8) &&
           (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::number(&this_00->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(SPxId *)&result_2), (this_00->integerVariables).data[iVar8] == 1)) {
          return -1;
        }
      }
      else if (0 < iVar8) {
        return -1;
      }
    }
    else if (this_00->polishObj == POLISH_INTEGRALITY) {
      if (iVar8 < 0) {
        return -1;
      }
      if (((iVar8 != 0) &&
          ((this_00->integerVariables).thesize ==
           (this_00->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum)) &&
         (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number(&this_00->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,(SPxId *)&result_2), (this_00->integerVariables).data[iVar8] == 0)) {
        return -1;
      }
    }
  }
  else if (iVar6 < 0) {
    iVar8 = (*(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxRatioTester[3])(this);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::epsilon((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&bestDelta.m_backend,
              (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)CONCAT44(extraout_var_00,iVar8));
    result_2.m_backend.fpclass = cpp_dec_float_finite;
    result_2.m_backend.prec_elem = 10;
    result_2.m_backend.data._M_elems[0] = 0;
    result_2.m_backend.data._M_elems[1] = 0;
    result_2.m_backend.data._M_elems[2] = 0;
    result_2.m_backend.data._M_elems[3] = 0;
    result_2.m_backend.data._M_elems[4] = 0;
    result_2.m_backend.data._M_elems[5] = 0;
    result_2.m_backend.data._M_elems._24_5_ = 0;
    result_2.m_backend.data._M_elems[7]._1_3_ = 0;
    result_2.m_backend.data._M_elems._32_5_ = 0;
    result_2.m_backend.data._M_elems[9]._1_3_ = 0;
    result_2.m_backend.exp = 0;
    result_2.m_backend.neg = false;
    result.m_backend.data._M_elems[0] = 2;
    result.m_backend.data._M_elems[1] = 0;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,long_long>
              (&result_2.m_backend,&bestDelta.m_backend,(longlong *)&result);
    tVar4 = boost::multiprecision::operator>
                      (&this->minStab,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_2.m_backend);
    if (!tVar4) {
      return iVar6;
    }
  }
  *(ulong *)((val->m_backend).data._M_elems + 8) =
       CONCAT35(sel.m_backend.data._M_elems[9]._1_3_,sel.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((val->m_backend).data._M_elems + 4) = sel.m_backend.data._M_elems._16_8_;
  *(ulong *)((val->m_backend).data._M_elems + 6) =
       CONCAT35(sel.m_backend.data._M_elems[7]._1_3_,sel.m_backend.data._M_elems._24_5_);
  *(undefined8 *)(val->m_backend).data._M_elems = sel.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 2) = sel.m_backend.data._M_elems._8_8_;
  (val->m_backend).exp = sel.m_backend.exp;
  (val->m_backend).neg = sel.m_backend.neg;
  (val->m_backend).fpclass = sel.m_backend.fpclass;
  (val->m_backend).prec_elem = sel.m_backend.prec_elem;
  if (-1 < iVar6) {
    tighten(this);
  }
  return iVar6;
}

Assistant:

int SPxFastRT<R>::selectLeave(R& val, R, bool polish)
{
   R maxabs, max, sel;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int leave = -1;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::ENTER);

   // force instable pivot iff true (see explanation in enter.cpp and spxsolve.hpp)
   bool instable = this->solver()->instableEnter;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableEnterId.isValid());

   resetTols();

   if(val > epsilonZero())
   {
      do
      {
         // phase 1:
         max = val;
         maxabs = 0.0;
         leave = maxDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!maxShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = maxSelect(sel, lowstab, bestDelta, max);
            else
               leave = maxSelect(sel, stab, bestDelta, max);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         max = val;
         maxabs = 0;
         leave = minDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!minShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = minSelect(sel, lowstab, bestDelta, max);
            else
               leave = minSelect(sel, stab, bestDelta, max);

            assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId())
                   || this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                            leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else
      return -1;

   SPX_DEBUG(

      if(leave >= 0)
      std::cout
      << "DFSTRT01 "
      << this->thesolver->basis().iteration() << "("
      << std::setprecision(6) << this->thesolver->value() << ","
      << std::setprecision(2) << this->thesolver->basis().stability() << "):"
      << leave << "\t"
      << std::setprecision(4) << sel << " "
      << std::setprecision(4) << this->thesolver->fVec().delta()[leave] << " "
      << std::setprecision(6) << maxabs
      << std::endl;
      else
         std::cout << "DFSTRT02 " << this->thesolver->basis().iteration()
         << ": skipping instable pivot" << std::endl;
      )

         if(polish && leave >= 0)
         {
            assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
            SPxId leaveId = this->thesolver->baseId(leave);

            // decide whether the chosen leave index contributes to the polishing objective
            if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
            {
               // only allow (integer) variables to leave the basis
               if(leaveId.isSPxRowId())
                  return -1;
               else if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(leaveId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 0)
                     return -1;
               }
            }
            else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
            {
               // only allow slacks and continuous variables to leave the basis
               if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(this->thesolver->baseId(leave).isSPxColId()
                        && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 1)
                     return -1;
               }
               else if(this->thesolver->baseId(leave).isSPxColId())
                  return -1;
            }
         }